

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::BeginExecution(FunctionBody *this)

{
  undefined1 *puVar1;
  
  this->m_DEBUG_executionCount = this->m_DEBUG_executionCount + 1;
  puVar1 = &(this->counters).field_0x1;
  *puVar1 = *puVar1 | 1;
  LOCK();
  this->m_depth = this->m_depth + 1;
  UNLOCK();
  return;
}

Assistant:

void
    FunctionBody::BeginExecution()
    {
#if DBG
        m_DEBUG_executionCount++;
        this->LockDownCounters();
#endif
        // Don't allow loop headers to be released while the function is executing
        ::InterlockedIncrement(&this->m_depth);
    }